

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<int>::Swap(RepeatedField<int> *this,RepeatedField<int> *other)

{
  Rep *pRVar1;
  Arena *pAVar2;
  LogMessage *other_00;
  Arena *pAVar3;
  RepeatedField<int> temp;
  LogFinisher local_69;
  RepeatedField<int> local_68;
  LogMessage local_50;
  
  if (this != other) {
    if (this->rep_ == (Rep *)0x0) {
      pAVar2 = (Arena *)0x0;
    }
    else {
      pAVar2 = this->rep_->arena;
    }
    pRVar1 = other->rep_;
    if (pRVar1 == (Rep *)0x0) {
      pAVar3 = (Arena *)0x0;
    }
    else {
      pAVar3 = pRVar1->arena;
    }
    if (pAVar2 == pAVar3) {
      InternalSwap(this,other);
      return;
    }
    if (pRVar1 == (Rep *)0x0) {
      pAVar2 = (Arena *)0x0;
    }
    else {
      pAVar2 = pRVar1->arena;
    }
    local_68.current_size_ = 0;
    local_68.total_size_ = 0;
    local_68.rep_ = (Rep *)0x0;
    if (pAVar2 != (Arena *)0x0) {
      local_68.rep_ = (Rep *)Arena::AllocateAligned(pAVar2,(type_info *)&char::typeinfo,8);
      (local_68.rep_)->arena = pAVar2;
    }
    if (&local_68 == this) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4b6);
      other_00 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&other) != (this): ");
      internal::LogFinisher::operator=(&local_69,other_00);
      internal::LogMessage::~LogMessage(&local_50);
    }
    if (this->current_size_ != 0) {
      Reserve(&local_68,this->current_size_ + local_68.current_size_);
      memcpy((local_68.rep_)->elements + local_68.current_size_,this->rep_->elements,
             (long)this->current_size_ << 2);
      local_68.current_size_ = local_68.current_size_ + this->current_size_;
    }
    this->current_size_ = 0;
    if (other->current_size_ != 0) {
      Reserve(this,other->current_size_);
      memcpy(this->rep_->elements + this->current_size_,other->rep_->elements,
             (long)other->current_size_ << 2);
      this->current_size_ = this->current_size_ + other->current_size_;
    }
    if (&local_68 != other) {
      InternalSwap(other,&local_68);
    }
    if ((local_68.rep_ != (Rep *)0x0) && ((local_68.rep_)->arena == (Arena *)0x0)) {
      operator_delete(local_68.rep_,(long)local_68.total_size_ * 4 + 8);
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other->GetArenaNoVirtual());
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}